

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

value * mjs::anon_unknown_63::array_pop
                  (value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,
                  object_ptr *o)

{
  uint32_t uVar1;
  object *poVar2;
  global_object *pgVar3;
  uint32_t index;
  value local_128;
  string local_100;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_c9;
  undefined1 local_c8 [8];
  wstring idx_str;
  string local_80 [2];
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_60;
  value local_50;
  uint32_t local_24;
  object_ptr *poStack_20;
  uint32_t l;
  object_ptr *o_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  value *res;
  
  poStack_20 = o;
  o_local = (object_ptr *)global;
  global_local = (gc_heap_ptr<mjs::global_object> *)__return_storage_ptr__;
  poVar2 = gc_heap_ptr<mjs::object>::operator->(o);
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_60,L"length");
  (**poVar2->_vptr_object)(&local_50,poVar2,&local_60);
  uVar1 = to_uint32(&local_50);
  value::~value(&local_50);
  local_24 = uVar1;
  if (uVar1 == 0) {
    poVar2 = gc_heap_ptr<mjs::object>::operator->(poStack_20);
    pgVar3 = gc_heap_ptr<mjs::global_object>::operator->((gc_heap_ptr<mjs::global_object> *)o_local)
    ;
    (*(pgVar3->super_object)._vptr_object[0x13])(local_80,pgVar3,"length");
    value::value((value *)((long)&idx_str.field_2 + 8),0.0);
    (*poVar2->_vptr_object[1])(poVar2,local_80,(undefined1 *)((long)&idx_str.field_2 + 8),0);
    value::~value((value *)((long)&idx_str.field_2 + 8));
    string::~string(local_80);
    value::value(__return_storage_ptr__,(value *)value::undefined);
  }
  else {
    index_string_abi_cxx11_((wstring *)local_c8,(mjs *)(ulong)(uVar1 - 1),index);
    local_c9 = 0;
    poVar2 = gc_heap_ptr<mjs::object>::operator->(poStack_20);
    local_e0 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_c8);
    (**poVar2->_vptr_object)(__return_storage_ptr__,poVar2,local_e0);
    poVar2 = gc_heap_ptr<mjs::object>::operator->(poStack_20);
    local_f0 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_c8);
    (*poVar2->_vptr_object[2])(poVar2,local_f0);
    poVar2 = gc_heap_ptr<mjs::object>::operator->(poStack_20);
    pgVar3 = gc_heap_ptr<mjs::global_object>::operator->((gc_heap_ptr<mjs::global_object> *)o_local)
    ;
    (*(pgVar3->super_object)._vptr_object[0x13])(&local_100,pgVar3,"length");
    value::value(&local_128,(double)(local_24 - 1));
    (*poVar2->_vptr_object[1])(poVar2,&local_100,&local_128,0);
    value::~value(&local_128);
    string::~string(&local_100);
    local_c9 = 1;
    std::__cxx11::wstring::~wstring((wstring *)local_c8);
  }
  return __return_storage_ptr__;
}

Assistant:

value array_pop(const gc_heap_ptr<global_object>& global, const object_ptr& o) {
    const uint32_t l = to_uint32(o->get(L"length"));
    if (l == 0) {
        o->put(global->common_string("length"), value{0.});
        return value::undefined;
    }
    const auto idx_str = index_string(l - 1);
    auto res = o->get(idx_str);
    o->delete_property(idx_str);
    o->put(global->common_string("length"), value{static_cast<double>(l-1)});
    return res;
}